

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeTree.cpp
# Opt level: O1

void __thiscall
Indexing::CodeTree::optimizeMemoryAfterRemoval
          (CodeTree *this,Stack<Indexing::CodeTree::CodeOp_*> *firstsInBlocks,CodeOp *removedOp)

{
  CodeOp **ppCVar1;
  ulong uVar2;
  CodeBlock *pCVar3;
  SearchStruct *pSVar4;
  long lVar5;
  pointer *pppCVar6;
  pointer *pppCVar7;
  pointer ppCVar8;
  long lVar9;
  SearchStruct *pSVar10;
  CodeOp *pCVar11;
  SearchStruct *pSVar12;
  SearchStruct *pSVar13;
  bool bVar14;
  CodeOp **tgtPtr;
  CodeOp firstOpCopy;
  CodeOp **local_50;
  CodeOp local_48;
  
  ppCVar1 = firstsInBlocks->_cursor;
  firstsInBlocks->_cursor = ppCVar1 + -1;
  pSVar13 = (SearchStruct *)ppCVar1[-1];
  do {
    for (; (pSVar13 < removedOp &&
           ((((SearchStruct *)removedOp)->landingOp)._alternative == (CodeOp *)0x0));
        removedOp = (CodeOp *)
                    &(((SearchStruct *)((long)removedOp + -0x30))->targets).
                     super__Vector_base<Indexing::CodeTree::CodeOp_*,_std::allocator<Indexing::CodeTree::CodeOp_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish) {
    }
    if ((SearchStruct *)removedOp != pSVar13) {
      (((SearchStruct *)removedOp)->landingOp)._content = 0;
      return;
    }
    pCVar11 = (pSVar13->landingOp)._alternative;
    pSVar12 = (SearchStruct *)removedOp;
    if (((firstsInBlocks->_cursor == firstsInBlocks->_stack) && (pCVar11 != (CodeOp *)0x0)) &&
       ((pCVar11->_content & 7) == 6)) {
      (pSVar13->landingOp)._content = 0;
LAB_002e1e5c:
      bVar14 = false;
      pSVar10 = pSVar13;
    }
    else {
      pppCVar7 = &pSVar13[-1].targets.
                  super__Vector_base<Indexing::CodeTree::CodeOp_*,_std::allocator<Indexing::CodeTree::CodeOp_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_48._content = (pSVar13->landingOp)._content;
      local_48._alternative = (pSVar13->landingOp)._alternative;
      if (this->_clauseCodeTree == true) {
        pSVar10 = pSVar13;
        for (ppCVar8 = *pppCVar7; ppCVar8 != (pointer)0x0; ppCVar8 = (pointer)((long)ppCVar8 + -1))
        {
          uVar2 = (pSVar10->landingOp)._content;
          if (7 < uVar2 && ((uint)uVar2 & 7) == 2) {
            ILStruct::~ILStruct((ILStruct *)(uVar2 >> 3));
            operator_delete((ILStruct *)(uVar2 >> 3),8);
          }
          pSVar10 = (SearchStruct *)&pSVar10->kind;
        }
      }
      ::Lib::Vector<Indexing::CodeTree::CodeOp>::deallocate
                ((Vector<Indexing::CodeTree::CodeOp> *)pppCVar7);
      ppCVar1 = firstsInBlocks->_cursor;
      if (ppCVar1 == firstsInBlocks->_stack) {
        pCVar3 = (CodeBlock *)&pCVar11[-1]._alternative;
        if (pCVar11 == (CodeOp *)0x0) {
          pCVar3 = (CodeBlock *)0x0;
        }
        this->_entryPoint = pCVar3;
        goto LAB_002e1e5c;
      }
      firstsInBlocks->_cursor = ppCVar1 + -1;
      pSVar10 = (SearchStruct *)ppCVar1[-1];
      pSVar4 = pSVar10;
      if (((pSVar10->landingOp)._content & 7) == 6) {
        if ((SearchStruct *)(pSVar10->landingOp)._alternative == pSVar13) {
          (pSVar10->landingOp)._alternative = pCVar11;
          goto LAB_002e1e5c;
        }
        SearchStruct::getTargetOpPtr<false>(pSVar10,&local_48,&local_50);
        *local_50 = pCVar11;
        if (pCVar11 == (CodeOp *)0x0) {
          ppCVar8 = (pSVar10->targets).
                    super__Vector_base<Indexing::CodeTree::CodeOp_*,_std::allocator<Indexing::CodeTree::CodeOp_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar5 = (long)(pSVar10->targets).
                        super__Vector_base<Indexing::CodeTree::CodeOp_*,_std::allocator<Indexing::CodeTree::CodeOp_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar8;
          if (lVar5 != 0) {
            lVar5 = lVar5 >> 3;
            lVar9 = 0;
            do {
              if (ppCVar8[lVar9] != (CodeOp *)0x0) {
                pCVar11 = (CodeOp *)0x0;
                goto LAB_002e1d9b;
              }
              lVar9 = lVar9 + 1;
            } while (lVar5 + (ulong)(lVar5 == 0) != lVar9);
          }
          pCVar11 = (pSVar10->landingOp)._alternative;
          SearchStruct::destroy(pSVar10);
          ppCVar1 = firstsInBlocks->_cursor;
          firstsInBlocks->_cursor = ppCVar1 + -1;
          pSVar4 = (SearchStruct *)ppCVar1[-1];
          bVar14 = true;
        }
        else {
LAB_002e1d9b:
          bVar14 = false;
          pSVar10 = pSVar13;
        }
        pSVar13 = pSVar10;
        if (bVar14) goto LAB_002e1e22;
        bVar14 = false;
      }
      else {
LAB_002e1e22:
        ppCVar8 = pSVar4[-1].targets.
                  super__Vector_base<Indexing::CodeTree::CodeOp_*,_std::allocator<Indexing::CodeTree::CodeOp_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        lVar5 = 0x10;
        pppCVar7 = &pSVar4[-1].targets.
                    super__Vector_base<Indexing::CodeTree::CodeOp_*,_std::allocator<Indexing::CodeTree::CodeOp_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        do {
          pppCVar6 = pppCVar7;
          lVar9 = lVar5;
          pppCVar7 = pppCVar6 + 2;
          lVar5 = lVar9 + 0x10;
        } while ((SearchStruct *)pppCVar6[3] != pSVar13);
        pppCVar6[3] = (pointer)pCVar11;
        if (*pppCVar7 != (pointer)0x0 && ((ulong)*pppCVar7 & 7) == 0) goto LAB_002e1e5c;
        do {
          bVar14 = (long)ppCVar8 << 4 == lVar9;
          pSVar12 = (SearchStruct *)pppCVar7;
          pSVar10 = pSVar4;
          if ((bVar14) ||
             (pSVar12 = (SearchStruct *)removedOp, pSVar10 = pSVar13,
             *(long *)((long)&(pSVar4->landingOp)._alternative + lVar9) != 0)) break;
          uVar2 = *(ulong *)((long)&(pSVar4->landingOp)._content + lVar9);
          lVar9 = lVar9 + 0x10;
        } while (uVar2 == 0 || (uVar2 & 7) != 0);
      }
    }
    removedOp = &pSVar12->landingOp;
    pSVar13 = pSVar10;
    if (!bVar14) {
      return;
    }
  } while( true );
}

Assistant:

void CodeTree::optimizeMemoryAfterRemoval(Stack<CodeOp*>* firstsInBlocks, CodeOp* removedOp)
{
  ASS(removedOp->isFail());
  LOG_OP("Code tree removal memory optimization");
  LOG_OP("firstsInBlocks->size()="<<firstsInBlocks->size());

  //now let us remove unnecessary instructions and the free memory

  CodeOp* op=removedOp;
  ASS(firstsInBlocks->isNonEmpty());
  CodeOp* firstOp=firstsInBlocks->pop();
  for(;;) {
    //firstOp is in a CodeBlock
    ASS(!firstOp->isSearchStruct());
    //op is in the CodeBlock starting at firstOp
    ASS_LE(firstOp, op);
    ASS_G(firstOp+firstOpToCodeBlock(firstOp)->length(), op);

    while(op>firstOp && !op->alternative()) { ASS(!op->isSuccess()); op--; }

    ASS(!op->isSuccess());

    if(op!=firstOp) {
      ASS(op->alternative());
      //we only change the instruction, the alternative must remain unchanged
      op->makeFail();
      return;
    }
    CodeOp* alt=firstOp->alternative();

    CodeBlock* cb=firstOpToCodeBlock(firstOp);

    if(firstsInBlocks->isEmpty() && alt && alt->isSearchStruct()) {
      //We should remove the CodeBlock referenced by _entryPoint, but
      //we cannot replace it by its alternative as it is not a CodeBlock
      //(it's a SearchStruct). Therefore w will not delete it, just set
      //the first operation to fail.
      ASS_EQ(cb,_entryPoint);
      firstOp->makeFail();
      return;
    }

    CodeOp firstOpCopy= *firstOp;

    if(_clauseCodeTree) {
      //delete ILStruct objects
      size_t cbLen=cb->length();
      for(size_t i=0;i<cbLen;i++) {
	if((*cb)[i].isLitEnd()) {
	  delete (*cb)[i].getILS();
	}
      }
    }
    cb->deallocate(); //from now on we mustn't dereference firstOp

    if(firstsInBlocks->isEmpty()) {
      ASS(!alt || !alt->isSearchStruct());
      ASS_EQ(cb,_entryPoint);
      _entryPoint=alt ? firstOpToCodeBlock(alt) : 0;
      return;
    }

    //first operation in the CodeBlock that points to the current one (i.e. cb)
    CodeOp* prevFirstOp=firstsInBlocks->pop();

    if(prevFirstOp->isSearchStruct()) {
      if(prevFirstOp->alternative()==firstOp) {
	//firstOp was an alternative to the SearchStruct
	prevFirstOp->setAlternative(alt);
	return;
      }
      auto ss = prevFirstOp->getSearchStruct();
      CodeOp** tgtPtr;
      ALWAYS(ss->getTargetOpPtr<false>(firstOpCopy, tgtPtr));
      ASS_EQ(*tgtPtr, firstOp);
      *tgtPtr=alt;
      if(alt) {
	ASS( (ss->kind==SearchStruct::FN_STRUCT && alt->isCheckFun()) ||
	    (ss->kind==SearchStruct::GROUND_TERM_STRUCT && alt->isCheckGroundTerm()) );
	return;
      }
      for(size_t i=0; i<ss->length(); i++) {
	if(ss->targets[i]!=0) {
	  //the SearchStruct still contains something, so we won't delete it
	  //TODO: we might want to compress the SearchStruct, if there are too many zeroes
	  return;
	}
      }

      //if we're at this point, the SEARCH_STRUCT will be deleted
      firstOp=&ss->landingOp;
      alt=ss->landingOp.alternative();
      ss->destroy();

      //now let's continue as if there wasn't any SEARCH_STRUCT operation:)

      //the SEARCH_STRUCT is never the first operation in the CodeTree
      ASS(firstsInBlocks->isNonEmpty());
      prevFirstOp=firstsInBlocks->pop();
      //there never are two nested SEARCH_STRUCT operations
      ASS(!prevFirstOp->isSearchStruct());
    }

    CodeBlock* pcb=firstOpToCodeBlock(prevFirstOp);

    //operation that points to the current CodeBlock
    CodeOp* pointingOp=0;

    CodeOp* prevAfterLastOp=prevFirstOp+pcb->length();
    CodeOp* prevOp=prevFirstOp;
    while(prevOp->alternative()!=firstOp) {
      ASS_L(prevOp,prevAfterLastOp);
      prevOp++;
    }
    pointingOp=prevOp;

    pointingOp->setAlternative(alt);
    if(pointingOp->isSuccess()) {
      return;
    }

    prevOp++;
    while(prevOp!=prevAfterLastOp) {
      ASS_NEQ(prevOp->alternative(),firstOp);

      if(prevOp->alternative() || prevOp->isSuccess()) {
	//there is an operation after the pointingOp that cannot be lost
	return;
      }
      prevOp++;
    }

    firstOp=prevFirstOp;
    op=pointingOp;
  }
}